

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::EntryPointInfo::DumpNativeThrowSpanSequence(EntryPointInfo *this)

{
  SmallSpanSequence *this_00;
  StatementData SVar1;
  int iVar2;
  BOOL BVar3;
  NativeEntryPointData *pNVar4;
  DWORD_PTR DVar5;
  ptrdiff_t pVar6;
  Type TVar7;
  Type index;
  long lVar8;
  SmallSpanSequenceIter local_58;
  EntryPointInfo *local_40;
  StatementData local_38;
  StatementData data;
  
  pNVar4 = GetNativeEntryPointData(this);
  this_00 = pNVar4->nativeThrowSpanSequence;
  if (this_00 != (SmallSpanSequence *)0x0) {
    DVar5 = GetNativeAddress(this);
    local_40 = this;
    pVar6 = GetCodeSize(this);
    Output::Print(L"Native Throw Map: baseAddr: 0x%0Ix, size: 0x%Ix\nstatementId, offset range, address range\n"
                  ,DVar5,pVar6);
    TVar7 = 0;
    if (this_00->pStatementBuffer != (GrowingUint32HeapArray *)0x0) {
      TVar7 = this_00->pStatementBuffer->count;
    }
    if ((int)TVar7 < 1) {
      TVar7 = 0;
    }
    local_58.accumulatedIndex = -1;
    local_58.accumulatedSourceBegin = 0;
    local_58.accumulatedBytecodeBegin = 0;
    local_58.indexOfActualOffset = 0;
    for (index = 0; TVar7 != index; index = index + 1) {
      local_38.sourceBegin = 0;
      local_38.bytecodeBegin = 0;
      BVar3 = SmallSpanSequence::Item(this_00,index,&local_58,&local_38);
      SVar1 = local_38;
      if (BVar3 != 0) {
        iVar2 = local_38.bytecodeBegin;
        lVar8 = (long)local_38.bytecodeBegin;
        DVar5 = GetNativeAddress(local_40);
        Output::Print(L"S%4d, (%5d -----)  (0x%012Ix --------)\n",(ulong)SVar1 & 0xffffffff,
                      (ulong)(uint)iVar2,lVar8 + DVar5);
      }
    }
  }
  return;
}

Assistant:

void EntryPointInfo::DumpNativeThrowSpanSequence()
    {
        // Native Throw Map
        SmallSpanSequence * nativeThrowSpanSequence = this->GetNativeEntryPointData()->GetNativeThrowSpanSequence();
        if (nativeThrowSpanSequence)
        {
            Output::Print(_u("Native Throw Map: baseAddr: 0x%0Ix, size: 0x%Ix\nstatementId, offset range, address range\n"),
                          this->GetNativeAddress(),
                          this->GetCodeSize());

            int count = nativeThrowSpanSequence->Count();
            SmallSpanSequenceIter iter;
            for (int i = 0; i < count; i++)
            {
                StatementData data;
                if (nativeThrowSpanSequence->Item(i, iter, data))
                {
                    Output::Print(_u("S%4d, (%5d -----)  (0x%012Ix --------)\n"), data.sourceBegin, // statementIndex
                        data.bytecodeBegin, // nativeOffset
                        data.bytecodeBegin + this->GetNativeAddress());
                }
            }
        }
    }